

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

OptionsType * __thiscall
google::protobuf::DescriptorBuilder::AllocateOptionsImpl<google::protobuf::FieldDescriptor>
          (DescriptorBuilder *this,string_view name_scope,string_view element_name,Proto *proto,
          Span<const_int> options_path,string_view option_name,FlatAllocator *alloc)

{
  DescriptorPool *this_00;
  string_view el;
  string_view ns;
  string_view pc;
  string_view pc_00;
  bool bVar1;
  int iVar2;
  Type TVar3;
  int iVar4;
  LogMessage *pLVar5;
  Descriptor *extendee;
  UnknownField *this_01;
  DescriptorBuilder *to;
  char *pcVar6;
  AlphaNum *c;
  string_view from;
  FileDescriptor *local_270;
  FieldDescriptor *local_268;
  FieldDescriptor *field;
  size_t sStack_258;
  int i;
  char *local_250;
  Symbol local_248;
  Symbol msg_symbol;
  UnknownFieldSet *unknown_fields;
  OptionsToInterpret local_200;
  byte local_191;
  LogMessage local_190;
  Voidify local_179;
  string local_178;
  undefined1 local_158 [16];
  undefined1 local_145;
  bool parse_success;
  DescriptorBuilder *local_138;
  size_t sStack_130;
  AlphaNum local_128;
  AlphaNum local_f8;
  char *local_c8;
  char *pcStack_c0;
  AlphaNum local_b0;
  string local_80;
  string_view local_60;
  FieldOptions *local_50;
  FieldOptions *options;
  OptionsType *orig_options;
  Proto *proto_local;
  DescriptorBuilder *this_local;
  string_view element_name_local;
  string_view name_scope_local;
  
  c = (AlphaNum *)element_name._M_str;
  to = (DescriptorBuilder *)element_name._M_len;
  pcVar6 = name_scope._M_str;
  element_name_local._M_str = (char *)name_scope._M_len;
  orig_options = (OptionsType *)proto;
  proto_local = (Proto *)this;
  this_local = to;
  element_name_local._M_len = (size_t)c;
  bVar1 = FieldDescriptorProto::has_options(proto);
  if (bVar1) {
    options = FieldDescriptorProto::options((FieldDescriptorProto *)orig_options);
    local_50 = anon_unknown_24::
               FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ::AllocateArray<google::protobuf::FieldOptions>
                         (&alloc->
                           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                          ,1);
    bVar1 = FieldOptions::IsInitialized(options);
    if (bVar1) {
      MessageLite::SerializeAsString_abi_cxx11_(&local_178,(MessageLite *)options);
      local_158 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_178);
      from._M_str = (char *)local_50;
      from._M_len = local_158._8_8_;
      bVar1 = internal::ParseNoReflection(local_158._0_8_,from,(MessageLite *)to);
      std::__cxx11::string::~string((string *)&local_178);
      local_191 = 0;
      local_145 = bVar1;
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_190,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x16ba,"parse_success");
        local_191 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_190);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_179,pLVar5);
      }
      if ((local_191 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_190);
      }
      iVar2 = FieldOptions::uninterpreted_option_size(local_50);
      if (0 < iVar2) {
        ns._M_str = pcVar6;
        ns._M_len = (size_t)element_name_local._M_str;
        el._M_str = (char *)element_name_local._M_len;
        el._M_len = (size_t)this_local;
        anon_unknown_24::OptionsToInterpret::OptionsToInterpret
                  (&local_200,ns,el,options_path,&options->super_Message,&local_50->super_Message);
        std::
        vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
        ::push_back(&this->options_to_interpret_,&local_200);
        anon_unknown_24::OptionsToInterpret::~OptionsToInterpret(&local_200);
      }
      msg_symbol.ptr_ = (SymbolBase *)FieldOptions::unknown_fields(options);
      bVar1 = UnknownFieldSet::empty((UnknownFieldSet *)msg_symbol.ptr_);
      if (!bVar1) {
        sStack_258 = option_name._M_len;
        local_250 = option_name._M_str;
        local_248 = DescriptorPool::Tables::FindSymbol(this->tables_,option_name);
        TVar3 = Symbol::type(&local_248);
        if (TVar3 == MESSAGE) {
          field._4_4_ = 0;
          while( true ) {
            iVar2 = field._4_4_;
            iVar4 = UnknownFieldSet::field_count((UnknownFieldSet *)msg_symbol.ptr_);
            if (iVar4 <= iVar2) break;
            assert_mutex_held(this->pool_);
            this_00 = this->pool_;
            extendee = Symbol::descriptor(&local_248);
            this_01 = UnknownFieldSet::field((UnknownFieldSet *)msg_symbol.ptr_,field._4_4_);
            iVar2 = UnknownField::number(this_01);
            local_268 = DescriptorPool::InternalFindExtensionByNumberNoLock(this_00,extendee,iVar2);
            if (local_268 != (FieldDescriptor *)0x0) {
              local_270 = FieldDescriptor::file(local_268);
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
              ::erase<google::protobuf::FileDescriptor_const*>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                          *)&this->unused_dependency_,&local_270);
            }
            field._4_4_ = field._4_4_ + 1;
          }
        }
      }
      name_scope_local._M_str = (char *)local_50;
    }
    else {
      local_c8 = element_name_local._M_str;
      pc_00._M_str = pcVar6;
      pc_00._M_len = (size_t)element_name_local._M_str;
      pcStack_c0 = pcVar6;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_b0,pc_00);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_f8,".");
      local_138 = this_local;
      sStack_130 = element_name_local._M_len;
      pc._M_str = (char *)element_name_local._M_len;
      pc._M_len = (size_t)this_local;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_128,pc);
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_80,(lts_20250127 *)&local_b0,&local_f8,&local_128,c);
      local_60 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_80);
      AddError(this,local_60,&options->super_Message,OPTION_NAME,
               "Uninterpreted option is missing name or value.");
      std::__cxx11::string::~string((string *)&local_80);
      name_scope_local._M_str = (char *)FieldOptions::default_instance();
    }
  }
  else {
    name_scope_local._M_str = (char *)FieldOptions::default_instance();
  }
  return (OptionsType *)name_scope_local._M_str;
}

Assistant:

const typename DescriptorT::OptionsType* DescriptorBuilder::AllocateOptionsImpl(
    absl::string_view name_scope, absl::string_view element_name,
    const typename DescriptorT::Proto& proto,
    absl::Span<const int> options_path, absl::string_view option_name,
    internal::FlatAllocator& alloc) {
  if (!proto.has_options()) {
    return &DescriptorT::OptionsType::default_instance();
  }
  const typename DescriptorT::OptionsType& orig_options = proto.options();

  auto* options = alloc.AllocateArray<typename DescriptorT::OptionsType>(1);

  if (!orig_options.IsInitialized()) {
    AddError(absl::StrCat(name_scope, ".", element_name), orig_options,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    return &DescriptorT::OptionsType::default_instance();
  }

  const bool parse_success =
      internal::ParseNoReflection(orig_options.SerializeAsString(), *options);
  ABSL_DCHECK(parse_success);

  // Don't add to options_to_interpret_ unless there were uninterpreted
  // options.  This not only avoids unnecessary work, but prevents a
  // bootstrapping problem when building descriptors for descriptor.proto.
  // descriptor.proto does not contain any uninterpreted options, but
  // attempting to interpret options anyway will cause
  // OptionsType::GetDescriptor() to be called which may then deadlock since
  // we're still trying to build it.
  if (options->uninterpreted_option_size() > 0) {
    options_to_interpret_.push_back(OptionsToInterpret(
        name_scope, element_name, options_path, &orig_options, options));
  }

  // If the custom option is in unknown fields, no need to interpret it.
  // Remove the dependency file from unused_dependency.
  const UnknownFieldSet& unknown_fields = orig_options.unknown_fields();
  if (!unknown_fields.empty()) {
    // Can not use options->GetDescriptor() which may case deadlock.
    Symbol msg_symbol = tables_->FindSymbol(option_name);
    if (msg_symbol.type() == Symbol::MESSAGE) {
      for (int i = 0; i < unknown_fields.field_count(); ++i) {
        assert_mutex_held(pool_);
        const FieldDescriptor* field =
            pool_->InternalFindExtensionByNumberNoLock(
                msg_symbol.descriptor(), unknown_fields.field(i).number());
        if (field) {
          unused_dependency_.erase(field->file());
        }
      }
    }
  }
  return options;
}